

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O1

void __thiscall Thread::start(Thread *this,Priority priority,size_t stackSize)

{
  int iVar1;
  pthread_attr_t *__attr;
  pthread_attr_t attr;
  Log local_a0;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_90;
  Log local_88;
  Log local_78;
  Log local_68;
  pthread_attr_t local_58;
  
  if (priority == Idle) {
    __attr = &local_58;
    pthread_attr_init(__attr);
    iVar1 = pthread_attr_setschedpolicy(__attr,5);
    if (iVar1 != 0) {
      local_90.mValue = 1;
      Log::Log(&local_a0,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_90);
      Log::write(&local_68,(int)&local_a0,"pthread_attr_setschedpolicy failed",0xffffffff);
      if (local_68.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_a0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
  }
  else {
    __attr = (pthread_attr_t *)0x0;
  }
  if (stackSize != 0) {
    if (__attr == (pthread_attr_t *)0x0) {
      __attr = &local_58;
      pthread_attr_init(__attr);
    }
    iVar1 = pthread_attr_setstacksize(__attr,stackSize);
    if (iVar1 != 0) {
      local_90.mValue = 1;
      Log::Log(&local_a0,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_90);
      Log::write(&local_78,(int)&local_a0,"pthread_attr_setstacksize failed",0xffffffff);
      if (local_78.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_a0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
  }
  this->mRunning = true;
  iVar1 = pthread_create(&this->mThread,__attr,localStart,this);
  if (iVar1 != 0) {
    local_90.mValue = 1;
    Log::Log(&local_a0,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_90);
    Log::write(&local_88,(int)&local_a0,"pthread_create failed",0xffffffff);
    if (local_88.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_a0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if (__attr != (pthread_attr_t *)0x0) {
    pthread_attr_destroy(__attr);
  }
  return;
}

Assistant:

void Thread::start(Priority priority, size_t stackSize)
{
    pthread_attr_t attr;
    pthread_attr_t* pattr = 0;
    if (priority == Idle) {
#ifdef HAVE_SCHEDIDLE
        initAttr(&pattr, &attr);
        if (pthread_attr_setschedpolicy(pattr, SCHED_IDLE) != 0) {
            error() << "pthread_attr_setschedpolicy failed";
        }
#endif
    }
    if (stackSize > 0) {
        initAttr(&pattr, &attr);
        if (pthread_attr_setstacksize(pattr, stackSize) != 0) {
            error() << "pthread_attr_setstacksize failed";
        }
    }
    mRunning = true;
    if (pthread_create(&mThread, pattr, localStart, this) != 0) {
        error() << "pthread_create failed";
    }
    if (pattr) {
        pthread_attr_destroy(pattr);
    }
}